

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O0

void __thiscall adiak::catstring::catstring(catstring *this,string *cs)

{
  string *cs_local;
  catstring *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)cs);
  return;
}

Assistant:

catstring(std::string cs) { v = cs; }